

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::LDX(CPU *this,uint8_t argument)

{
  undefined3 in_register_00000031;
  
  this->X = argument;
  this->field_0x2e =
       argument >> 7 | (CONCAT31(in_register_00000031,argument) == 0) << 6 | this->field_0x2e & 0xbe
  ;
  return;
}

Assistant:

void CPU::LDX(uint8_t argument) {
	X = argument;
	if (X == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (X & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}